

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

void ghc::filesystem::create_hard_link(path *to,path *new_hard_link)

{
  bool bVar1;
  undefined8 uVar2;
  error_code ec;
  path *in_stack_00000088;
  path *in_stack_00000090;
  string *in_stack_00000098;
  filesystem_error *in_stack_000000a0;
  undefined1 in_stack_000000a8 [16];
  int in_stack_000001dc;
  path *in_stack_ffffffffffffff88;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  error_code local_20 [2];
  
  std::error_code::error_code
            ((error_code *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90));
  create_hard_link((path *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
                   in_stack_ffffffffffffff88,(error_code *)0x28e62c);
  bVar1 = std::error_code::operator_cast_to_bool(local_20);
  if (!bVar1) {
    return;
  }
  uVar2 = __cxa_allocate_exception(0x90);
  std::error_code::value(local_20);
  detail::systemErrorText<int>(in_stack_000001dc);
  filesystem_error::filesystem_error
            (in_stack_000000a0,in_stack_00000098,in_stack_00000090,in_stack_00000088,
             (error_code)in_stack_000000a8);
  __cxa_throw(uVar2,&filesystem_error::typeinfo,filesystem_error::~filesystem_error);
}

Assistant:

GHC_INLINE void create_hard_link(const path& to, const path& new_hard_link)
{
    std::error_code ec;
    create_hard_link(to, new_hard_link, ec);
    if (ec) {
        throw filesystem_error(detail::systemErrorText(ec.value()), to, new_hard_link, ec);
    }
}